

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboColorbufferTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::FboColorTexCubeArrayCase::preCheck(FboColorTexCubeArrayCase *this)

{
  bool bVar1;
  ContextType ctxType;
  NotSupportedError *this_00;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.m_context)->
                  m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.m_context)
                       ->m_contextInfo,"GL_EXT_texture_cube_map_array");
    if (!bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,
                 "Test requires extension GL_EXT_texture_cube_map_array or a context version equal or higher than 3.2"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboColorbufferTests.cpp"
                 ,0x80);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  FboTestCase::checkFormatSupport((FboTestCase *)this,(this->super_FboColorbufferCase).m_format);
  return;
}

Assistant:

void preCheck (void)
	{
		if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_cube_map_array"))
			TCU_THROW(NotSupportedError, "Test requires extension GL_EXT_texture_cube_map_array or a context version equal or higher than 3.2");

		checkFormatSupport(m_format);
	}